

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O2

void anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  string name;
  class_<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>,_anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_>
  local_60;
  char *local_58 [4];
  code *local_38;
  undefined8 local_30;
  arg local_28;
  
  python_name_abi_cxx11_();
  pybind11::
  class_<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>,_anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_>
  ::class_<>(&local_60,(m->super_object).super_handle.m_ptr,local_58[0]);
  local_28.name = "geometry";
  local_28._8_1_ = 2;
  pybind11::detail::initimpl::constructor<anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::
  execute<pybind11::class_<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>,_anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_>,_pybind11::arg,_0>
            (&local_60,&local_28);
  local_38 = Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::surface_geometry;
  local_30 = 0;
  pybind11::
  class_<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>>
  ::
  def<anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>(anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>::*)()const>
            ((class_<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>>
              *)&local_60,"surface_geometry",(offset_in_Model_to_subr *)&local_38);
  pybind11::object::~object((object *)&local_60);
  Model::
  register_python_data_type<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>
            (m,model);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Surface<TDimension, TRef>;
        using Base = SurfaceBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            .def(py::init<TRef>(), "geometry"_a)
            .def("surface_geometry", &Type::surface_geometry)
        ;

        Model::register_python_data_type<Type>(m, model);
    }